

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O1

void __thiscall
Frame::Frame(Frame *this,int frameId,Mat *projMatL,Mat *projMatR,Mat *worldRotation,
            Mat *worldTranslation)

{
  cv::Mat::Mat(&this->m_projMatL);
  cv::Mat::Mat(&this->m_projMatR);
  cv::Mat::Mat(&this->m_worldRotation);
  cv::Mat::Mat(&this->m_worldTranslation);
  (this->m_pointsFeatureRight).
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pointsFeatureRight).
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pointsFeatureLeft).
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pointsFeatureRight).
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pointsFeatureLeft).
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pointsFeatureLeft).
  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::operator=(&this->m_projMatL,projMatL);
  cv::Mat::operator=(&this->m_projMatR,projMatR);
  cv::Mat::operator=(&this->m_worldRotation,worldRotation);
  cv::Mat::operator=(&this->m_worldTranslation,worldTranslation);
  return;
}

Assistant:

Frame::Frame(int frameId, const cv::Mat projMatL, const cv::Mat projMatR, cv::Mat worldRotation, cv::Mat worldTranslation)
{
    m_projMatL = projMatL;
    m_projMatR = projMatR;
    m_worldRotation = worldRotation;
    m_worldTranslation = worldTranslation;

}